

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ConvolutionLayerParams::MergeFrom
          (ConvolutionLayerParams *this,ConvolutionLayerParams *from)

{
  void *pvVar1;
  LogMessage *other;
  WeightParams *pWVar2;
  ValidPadding *this_00;
  ValidPadding *from_00;
  SamePadding *this_01;
  SamePadding *from_01;
  WeightParams *pWVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x6e09);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(&this->kernelsize_,&from->kernelsize_);
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(&this->stride_,&from->stride_);
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom
            (&this->dilationfactor_,&from->dilationfactor_);
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(&this->outputshape_,&from->outputshape_)
  ;
  if ((from != (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) &&
     (from->weights_ != (WeightParams *)0x0)) {
    pWVar2 = mutable_weights(this);
    pWVar3 = from->weights_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  if ((from != (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) &&
     (from->bias_ != (WeightParams *)0x0)) {
    pWVar2 = mutable_bias(this);
    pWVar3 = from->bias_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  if (from->outputchannels_ != 0) {
    this->outputchannels_ = from->outputchannels_;
  }
  if (from->kernelchannels_ != 0) {
    this->kernelchannels_ = from->kernelchannels_;
  }
  if (from->ngroups_ != 0) {
    this->ngroups_ = from->ngroups_;
  }
  if (from->isdeconvolution_ == true) {
    this->isdeconvolution_ = true;
  }
  if (from->hasbias_ == true) {
    this->hasbias_ = true;
  }
  if (from->_oneof_case_[0] == 0x33) {
    this_01 = mutable_same(this);
    from_01 = same(from);
    SamePadding::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 0x32) {
    this_00 = mutable_valid(this);
    from_00 = valid(from);
    ValidPadding::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

void ConvolutionLayerParams::MergeFrom(const ConvolutionLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ConvolutionLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  kernelsize_.MergeFrom(from.kernelsize_);
  stride_.MergeFrom(from.stride_);
  dilationfactor_.MergeFrom(from.dilationfactor_);
  outputshape_.MergeFrom(from.outputshape_);
  if (from.has_weights()) {
    mutable_weights()->::CoreML::Specification::WeightParams::MergeFrom(from.weights());
  }
  if (from.has_bias()) {
    mutable_bias()->::CoreML::Specification::WeightParams::MergeFrom(from.bias());
  }
  if (from.outputchannels() != 0) {
    set_outputchannels(from.outputchannels());
  }
  if (from.kernelchannels() != 0) {
    set_kernelchannels(from.kernelchannels());
  }
  if (from.ngroups() != 0) {
    set_ngroups(from.ngroups());
  }
  if (from.isdeconvolution() != 0) {
    set_isdeconvolution(from.isdeconvolution());
  }
  if (from.hasbias() != 0) {
    set_hasbias(from.hasbias());
  }
  switch (from.ConvolutionPaddingType_case()) {
    case kValid: {
      mutable_valid()->::CoreML::Specification::ValidPadding::MergeFrom(from.valid());
      break;
    }
    case kSame: {
      mutable_same()->::CoreML::Specification::SamePadding::MergeFrom(from.same());
      break;
    }
    case CONVOLUTIONPADDINGTYPE_NOT_SET: {
      break;
    }
  }
}